

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O0

void soul::ASTUtilities::findAllMainProcessors
               (ModuleBase *module,
               vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
               *found)

{
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pool_ref<soul::AST::ModuleBase> *ppVar3;
  ProcessorBase *pPVar4;
  Expression *pEVar5;
  Constant *pCVar6;
  ModuleBase *module_00;
  pool_ref<soul::AST::ProcessorBase> local_80;
  pool_ptr<soul::AST::Constant> local_78;
  pool_ptr<soul::AST::Constant> c;
  Property *main;
  pool_ref<soul::AST::ModuleBase> local_58;
  pool_ptr<soul::AST::ProcessorBase> local_50;
  pool_ptr<soul::AST::ProcessorBase> pb;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ref<soul::AST::ModuleBase> *__end2;
  pool_ref<soul::AST::ModuleBase> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *local_20;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range2;
  vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
  *found_local;
  ModuleBase *module_local;
  
  __range2 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)found;
  found_local = (vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                 *)module;
  iVar2 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  __begin2 = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var,iVar2);
  local_20 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&__begin2;
  __end2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin(local_20);
  ppVar3 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end(local_20);
  for (; __end2 != ppVar3; __end2 = __end2 + 1) {
    pb.object = (ProcessorBase *)__end2;
    local_58 = (pool_ref<soul::AST::ModuleBase>)__end2->object;
    cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_50,&local_58);
    pool_ref<soul::AST::ModuleBase>::~pool_ref(&local_58);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_50);
    if (bVar1) {
      pPVar4 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_50);
      c.object = (Constant *)
                 AST::Annotation::findProperty<char[5]>(&pPVar4->annotation,(char (*) [5])"main");
      if (c.object != (Constant *)0x0) {
        pEVar5 = pool_ref<soul::AST::Expression>::operator->
                           ((pool_ref<soul::AST::Expression> *)
                            &((c.object)->super_Expression).super_Statement.super_ASTObject.
                             objectType);
        (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_78);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_78);
        if (bVar1) {
          pCVar6 = pool_ptr<soul::AST::Constant>::operator->(&local_78);
          bVar1 = soul::Value::getAsBool(&pCVar6->value);
          this = __range2;
          if (bVar1) {
            pPVar4 = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_50);
            pool_ref<soul::AST::ProcessorBase>::pool_ref<soul::AST::ProcessorBase,void>
                      (&local_80,pPVar4);
            std::
            vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
            ::push_back((vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                         *)this,&local_80);
            pool_ref<soul::AST::ProcessorBase>::~pool_ref(&local_80);
          }
        }
        pool_ptr<soul::AST::Constant>::~pool_ptr(&local_78);
      }
    }
    pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_50);
    module_00 = pool_ref::operator_cast_to_ModuleBase_((pool_ref *)pb.object);
    findAllMainProcessors
              (module_00,
               (vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                *)__range2);
  }
  return;
}

Assistant:

static void findAllMainProcessors (AST::ModuleBase& module, std::vector<pool_ref<AST::ProcessorBase>>& found)
    {
        for (auto& m : module.getSubModules())
        {
            if (auto pb = cast<AST::ProcessorBase> (m))
                if (auto main = pb->annotation.findProperty ("main"))
                    if (auto c = main->value->getAsConstant())
                        if (c->value.getAsBool())
                            found.push_back (*pb);

            findAllMainProcessors (m, found);
        }
    }